

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestRepeatedScalarDifferentTagSizes::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestRepeatedScalarDifferentTagSizes *_this;
  TestRepeatedScalarDifferentTagSizes *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestRepeatedScalarDifferentTagSizes *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestRepeatedScalarDifferentTagSizes_const*,proto2_unittest::TestRepeatedScalarDifferentTagSizes*>
                          ((TestRepeatedScalarDifferentTagSizes **)local_18,&local_20,
                           "&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_fixed32_,
               (RepeatedField<unsigned_int> *)(from_msg + 1));
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_int32_,(RepeatedField<int> *)(from_msg + 2));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_fixed64_,
               (RepeatedField<unsigned_long> *)(from_msg + 3));
    google::protobuf::RepeatedField<long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_int64_,(RepeatedField<long> *)(from_msg + 4));
    google::protobuf::RepeatedField<float>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_float_,(RepeatedField<float> *)(from_msg + 5));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              (&(local_20->field_0)._impl_.repeated_uint64_,
               (RepeatedField<unsigned_long> *)(from_msg + 6));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
             ,0x9e7f,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestRepeatedScalarDifferentTagSizes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRepeatedScalarDifferentTagSizes*>(&to_msg);
  auto& from = static_cast<const TestRepeatedScalarDifferentTagSizes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRepeatedScalarDifferentTagSizes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}